

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Matrix<int,_1,1,0,_1,1>,Eigen::Matrix<int,3,1,0,3,1>,int,int>
               (Matrix<int,__1,_1,_0,__1,_1> *dst,Matrix<int,_3,_1,_0,_3,_1> *src,
               assign_op<int,_int> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<int,_int> *param_2_local;
  Matrix<int,_3,_1,_0,_3,_1> *src_local;
  Matrix<int,__1,_1,_0,__1,_1> *dst_local;
  
  IVar1 = PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::rows
                    (&src->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>);
  cols = PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::cols
                   (&src->super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>);
  IVar2 = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>);
  if (IVar2 == IVar1) {
    IVar2 = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>);
    if (IVar2 == cols) goto LAB_001b60bd;
  }
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,IVar1,cols);
LAB_001b60bd:
  IVar2 = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<int, -1, 1>, SrcXprType = Eigen::Matrix<int, 3, 1>, T1 = int, T2 = int]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}